

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManPrintCo_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    pGVar2 = Gia_ObjFanin0(pObj);
    Gia_ManPrintCo_rec(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Gia_ManPrintCo_rec(p,pGVar2);
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin2(p,pObj);
      Gia_ManPrintCo_rec(p,pGVar2);
    }
  }
  Gia_ObjPrint(p,pObj);
  return;
}

Assistant:

void Gia_ManPrintCo_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManPrintCo_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManPrintCo_rec( p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
            Gia_ManPrintCo_rec( p, Gia_ObjFanin2(p, pObj) );
    }
    Gia_ObjPrint( p, pObj );
}